

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosType.h
# Opt level: O0

void __thiscall
adios2::helper::DimsArray::DimsArray
          (DimsArray *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *vec)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  CoreDims *in_RDI;
  size_t i;
  size_t **local_20;
  ulong local_18;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  CoreDims::CoreDims(in_RDI,sVar1,&in_RDI[1].DimCount);
  in_RDI[1].DimCount = 0;
  local_20 = &in_RDI[1].DimensSpan;
  do {
    *local_20 = (size_t *)0x0;
    local_20 = local_20 + 1;
  } while ((CoreDims *)local_20 != in_RDI + 0x11);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    if (sVar1 <= local_18) break;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_18)
    ;
    (&in_RDI[1].DimCount)[local_18] = *pvVar2;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

DimsArray(const std::vector<size_t> &vec) : CoreDims(vec.size(), &Dimensions[0])
    {
        for (size_t i = 0; i < vec.size(); i++)
        {
            Dimensions[i] = vec[i];
        }
    }